

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ons_test.cc
# Opt level: O0

int test_ons_empower_delete(void)

{
  code *pcVar1;
  char *__s;
  Ons *pOVar2;
  HttpTestListener *pHVar3;
  allocator<char> local_1a9;
  int ret;
  HttpTestListener *local_188;
  HttpTestListener *listener;
  string local_178;
  allocator<char> local_151;
  string local_150 [39];
  allocator<char> local_129;
  string local_128 [55];
  allocator<char> local_f1;
  string local_f0 [32];
  Ons *local_d0;
  Ons *ons;
  OnsOnsEmpowerDeleteResponseType resp;
  OnsOnsEmpowerDeleteRequestType req;
  
  aliyun::OnsOnsEmpowerDeleteRequestType::OnsOnsEmpowerDeleteRequestType
            ((OnsOnsEmpowerDeleteRequestType *)((long)&resp.help_url.field_2 + 8));
  aliyun::OnsOnsEmpowerDeleteResponseType::OnsOnsEmpowerDeleteResponseType
            ((OnsOnsEmpowerDeleteResponseType *)&ons);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_f0,"cn-hangzhou",&local_f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_128,"my_appid",&local_129);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_150,"my_secret",&local_151);
  pOVar2 = (Ons *)aliyun::Ons::CreateOnsClient(local_f0,local_128,local_150);
  std::__cxx11::string::~string(local_150);
  std::allocator<char>::~allocator(&local_151);
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::~allocator(&local_129);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator(&local_f1);
  local_d0 = pOVar2;
  if (pOVar2 == (Ons *)0x0) {
    aliyun::OnsOnsEmpowerDeleteResponseType::~OnsOnsEmpowerDeleteResponseType
              ((OnsOnsEmpowerDeleteResponseType *)&ons);
    aliyun::OnsOnsEmpowerDeleteRequestType::~OnsOnsEmpowerDeleteRequestType
              ((OnsOnsEmpowerDeleteRequestType *)((long)&resp.help_url.field_2 + 8));
    return 0;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_178,"127.0.0.1:12234",(allocator<char> *)((long)&listener + 7));
  aliyun::Ons::SetProxyHost(pOVar2,&local_178);
  std::__cxx11::string::~string((string *)&local_178);
  std::allocator<char>::~allocator((allocator<char> *)((long)&listener + 7));
  aliyun::Ons::SetUseTls(local_d0,false);
  pHVar3 = (HttpTestListener *)operator_new(0x180);
  HttpTestListener::HttpTestListener(pHVar3,0x2fca);
  __s = test_ons_empower_delete_response;
  local_188 = pHVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&ret,__s,&local_1a9);
  HttpTestListener::SetResponseBody(pHVar3,(string *)&ret);
  std::__cxx11::string::~string((string *)&ret);
  std::allocator<char>::~allocator(&local_1a9);
  HttpTestListener::Start(local_188);
  std::__cxx11::string::operator=((string *)(resp.help_url.field_2._M_local_buf + 8),"OnsRegionId");
  std::__cxx11::string::operator=
            ((string *)(req.ons_region_id.field_2._M_local_buf + 8),"OnsPlatform");
  std::__cxx11::string::operator=
            ((string *)(req.ons_platform.field_2._M_local_buf + 8),"PreventCache");
  std::__cxx11::string::operator=
            ((string *)(req.prevent_cache.field_2._M_local_buf + 8),"EmpowerUser");
  std::__cxx11::string::operator=((string *)(req.empower_user.field_2._M_local_buf + 8),"Topic");
  aliyun::Ons::OnsEmpowerDelete
            (local_d0,(OnsOnsEmpowerDeleteRequestType *)((long)&resp.help_url.field_2 + 8),
             (OnsOnsEmpowerDeleteResponseType *)&ons,(OnsErrorInfo *)0x0);
  HttpTestListener::WaitComplete(local_188);
  pHVar3 = local_188;
  if (local_188 != (HttpTestListener *)0x0) {
    HttpTestListener::~HttpTestListener(local_188);
    operator_delete(pHVar3,0x180);
  }
  pOVar2 = local_d0;
  if (local_d0 != (Ons *)0x0) {
    aliyun::Ons::~Ons(local_d0);
    operator_delete(pOVar2,0x38);
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

static int test_ons_empower_delete() {
  OnsOnsEmpowerDeleteRequestType req;
  OnsOnsEmpowerDeleteResponseType resp;
  Ons* ons = Ons::CreateOnsClient("cn-hangzhou", "my_appid", "my_secret");
  if(!ons) return 0;
  ons->SetProxyHost("127.0.0.1:12234");
  ons->SetUseTls(false);
  HttpTestListener* listener = new HttpTestListener(12234);
  listener->SetResponseBody(test_ons_empower_delete_response);
  listener->Start();
  req.ons_region_id = "OnsRegionId";
  req.ons_platform = "OnsPlatform";
  req.prevent_cache = "PreventCache";
  req.empower_user = "EmpowerUser";
  req.topic = "Topic";
  int ret = ons->OnsEmpowerDelete(req, &resp, NULL);
  listener->WaitComplete();
  delete listener;
  delete ons;
}